

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O0

int CTcSymEnumBase::load_from_obj_file(CVmFile *fp,textchar_t *fname,ulong *enum_xlat)

{
  tc_symtype_t tVar1;
  char *__s;
  size_t len_00;
  ulong uVar2;
  char *str;
  CTcPrsSymtab *pCVar3;
  ulong uVar4;
  long in_RDX;
  int is_token;
  char buf [32];
  CTcSymEnum *sym;
  ulong id;
  size_t len;
  char *txt;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  CTcPrsSymtab *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  CVmFile *in_stack_ffffffffffffff70;
  CTcSymEnum *in_stack_ffffffffffffff80;
  tc_symtype_t in_stack_ffffffffffffff9c;
  textchar_t *in_stack_ffffffffffffffa0;
  CTcSymbolBase *in_stack_ffffffffffffffa8;
  CVmFile *in_stack_ffffffffffffffb0;
  CTcSymEnumBase *local_40;
  int local_4;
  
  __s = CTcSymbolBase::base_read_from_sym_file(in_stack_ffffffffffffffb0);
  if (__s == (char *)0x0) {
    local_4 = 1;
  }
  else {
    len_00 = strlen(__s);
    uVar2 = CVmFile::read_uint4((CVmFile *)in_stack_ffffffffffffff60);
    CVmFile::read_bytes(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                        (size_t)in_stack_ffffffffffffff60);
    CTcParser::get_global_symtab(G_prs);
    local_40 = (CTcSymEnumBase *)
               CTcPrsSymtab::find(in_stack_ffffffffffffff60,
                                  (textchar_t *)
                                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                  0x211d70);
    if (local_40 == (CTcSymEnumBase *)0x0) {
      local_40 = (CTcSymEnumBase *)CTcSymbolBase::operator_new(0x211d8b);
      str = (char *)CTcParser::new_enum_id(G_prs);
      CTcSymEnum::CTcSymEnum
                (in_stack_ffffffffffffff80,str,len_00,(int)((ulong)__s >> 0x20),(ulong)local_40,
                 in_stack_ffffffffffffff5c);
      pCVar3 = CTcParser::get_global_symtab(G_prs);
      (*pCVar3->_vptr_CTcPrsSymtab[3])(pCVar3,local_40);
    }
    else {
      tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)local_40);
      if (tVar1 != TC_SYM_ENUM) {
        CTcSymbolBase::log_objfile_conflict
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        return 0;
      }
    }
    uVar4 = get_enum_id(local_40);
    *(ulong *)(in_RDX + uVar2 * 8) = uVar4;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CTcSymEnumBase::load_from_obj_file(class CVmFile *fp,
                                       const textchar_t *fname,
                                       ulong *enum_xlat)
{
    const char *txt;
    size_t len;
    ulong id;
    CTcSymEnum *sym;
    char buf[32];
    int is_token;

    /* read the symbol name information */
    if ((txt = base_read_from_sym_file(fp)) == 0)
        return 1;
    len = strlen(txt);

    /* read our enumerator ID */
    id = fp->read_uint4();

    /* read our flags */
    fp->read_bytes(buf, 1);

    /* get the 'token' flag */
    is_token = ((buf[0] & 1) != 0);

    /* 
     *   If this symbol is already defined, make sure the original
     *   definition is an enum.  If it's not defined, define it anew.  
     */
    sym = (CTcSymEnum *)G_prs->get_global_symtab()->find(txt, len);
    if (sym == 0)
    {
        /* 
         *   It's not defined yet - create the new definition and add it
         *   to the symbol table.  Allocate a new enumerator ID for the
         *   symbol in the normal fashion.  
         */
        sym = new CTcSymEnum(txt, len, FALSE, G_prs->new_enum_id(), is_token);
        G_prs->get_global_symtab()->add_entry(sym);
    }
    else if (sym->get_type() != TC_SYM_ENUM)
    {
        /* 
         *   It's not already defined as an enumerator - log a symbol type
         *   conflict error 
         */
        sym->log_objfile_conflict(fname, TC_SYM_ENUM);

        /* 
         *   proceed despite the error, since this is merely a symbol
         *   conflict and not a file corruption 
         */
        return 0;
    }

    /*
     *   Set the translation table entry for the symbol.  We know the
     *   original ID local to the object file, and we know the new global
     *   enum ID.  
     */
    enum_xlat[id] = sym->get_enum_id();

    /* success */
    return 0;
}